

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UBool calendar_cleanup(void)

{
  if (gService != (ICULocaleService *)0x0) {
    (*(gService->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[1])();
    gService = (ICULocaleService *)0x0;
  }
  LOCK();
  gServiceInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool calendar_cleanup(void) {
#if !UCONFIG_NO_SERVICE
    if (gService) {
        delete gService;
        gService = NULL;
    }
    gServiceInitOnce.reset();
#endif
    return TRUE;
}